

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pkcs8.cc
# Opt level: O0

int pkcs12_key_gen(char *pass,size_t pass_len,uint8_t *salt,size_t salt_len,uint8_t id,
                  uint32_t iterations,size_t out_len,uint8_t *out,EVP_MD *md)

{
  int iVar1;
  uint uVar2;
  undefined4 extraout_var;
  ulong uVar3;
  ulong uVar4;
  size_t size;
  size_t local_240;
  ulong local_218;
  size_t j;
  ulong uStack_208;
  uint carry;
  size_t i_3;
  size_t i_2;
  uint8_t B [128];
  size_t todo;
  uint32_t iter;
  uint A_len;
  uint8_t A [64];
  size_t i_1;
  size_t i;
  size_t P_len;
  size_t S_len;
  uint8_t D [128];
  size_t block_size;
  size_t I_len;
  size_t pass_raw_len;
  uint8_t *I;
  uint8_t *pass_raw;
  EVP_MD_CTX ctx;
  int ret;
  uint32_t iterations_local;
  uint8_t id_local;
  size_t salt_len_local;
  uint8_t *salt_local;
  size_t pass_len_local;
  char *pass_local;
  
  if (iterations == 0) {
    ERR_put_error(0x13,0,0x81,
                  "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/pkcs8/pkcs8.cc"
                  ,0x44);
    pass_local._4_4_ = 0;
  }
  else {
    ctx.pctx_ops._4_4_ = 0;
    EVP_MD_CTX_init((EVP_MD_CTX *)&pass_raw);
    I = (uint8_t *)0x0;
    pass_raw_len = 0;
    I_len = 0;
    if ((pass == (char *)0x0) ||
       (iVar1 = pkcs12_encode_password(pass,pass_len,&I,&I_len), iVar1 != 0)) {
      iVar1 = EVP_MD_block_size((EVP_MD *)md);
      D._120_8_ = CONCAT44(extraout_var,iVar1);
      OPENSSL_memset(&S_len,(uint)id,D._120_8_);
      if (((salt_len + D._120_8_) - 1 < salt_len) || ((I_len + D._120_8_) - 1 < I_len)) {
        ERR_put_error(0x13,0,0x45,
                      "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/pkcs8/pkcs8.cc"
                      ,0x6a);
      }
      else {
        uVar3 = D._120_8_ * (((salt_len + D._120_8_) - 1) / (ulong)D._120_8_);
        uVar4 = D._120_8_ * (((I_len + D._120_8_) - 1) / (ulong)D._120_8_);
        size = uVar3 + uVar4;
        if (size < uVar3) {
          ERR_put_error(0x13,0,0x45,
                        "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/pkcs8/pkcs8.cc"
                        ,0x71);
        }
        else {
          pass_raw_len = (size_t)OPENSSL_malloc(size);
          if ((size == 0) || ((void *)pass_raw_len != (void *)0x0)) {
            for (i_1 = 0; i_1 < uVar3; i_1 = i_1 + 1) {
              *(uint8_t *)(pass_raw_len + i_1) = salt[i_1 % salt_len];
            }
            A[0x38] = '\0';
            A[0x39] = '\0';
            A[0x3a] = '\0';
            A[0x3b] = '\0';
            A[0x3c] = '\0';
            A[0x3d] = '\0';
            A[0x3e] = '\0';
            A[0x3f] = '\0';
            for (; (ulong)A._56_8_ < uVar4; A._56_8_ = A._56_8_ + 1) {
              *(uint8_t *)(pass_raw_len + A._56_8_ + uVar3) = I[(ulong)A._56_8_ % I_len];
            }
            while (out_len != 0) {
              iVar1 = EVP_DigestInit_ex((EVP_MD_CTX *)&pass_raw,(EVP_MD *)md,(ENGINE *)0x0);
              if ((((iVar1 == 0) ||
                   (iVar1 = EVP_DigestUpdate((EVP_MD_CTX *)&pass_raw,&S_len,D._120_8_), iVar1 == 0))
                  || (iVar1 = EVP_DigestUpdate((EVP_MD_CTX *)&pass_raw,(void *)pass_raw_len,size),
                     iVar1 == 0)) ||
                 (iVar1 = EVP_DigestFinal_ex((EVP_MD_CTX *)&pass_raw,(uchar *)&iter,
                                             (uint *)((long)&todo + 4)), iVar1 == 0))
              goto LAB_002dfd1c;
              for (todo._0_4_ = 1; (uint)todo < iterations; todo._0_4_ = (uint)todo + 1) {
                iVar1 = EVP_DigestInit_ex((EVP_MD_CTX *)&pass_raw,(EVP_MD *)md,(ENGINE *)0x0);
                if (((iVar1 == 0) ||
                    (iVar1 = EVP_DigestUpdate((EVP_MD_CTX *)&pass_raw,&iter,(ulong)todo._4_4_),
                    iVar1 == 0)) ||
                   (iVar1 = EVP_DigestFinal_ex((EVP_MD_CTX *)&pass_raw,(uchar *)&iter,
                                               (uint *)((long)&todo + 4)), iVar1 == 0))
                goto LAB_002dfd1c;
              }
              if (out_len < todo._4_4_) {
                local_240 = out_len;
              }
              else {
                local_240 = (size_t)todo._4_4_;
              }
              B[0x78] = (undefined1)local_240;
              B[0x79] = local_240._1_1_;
              B[0x7a] = local_240._2_1_;
              B[0x7b] = local_240._3_1_;
              B[0x7c] = local_240._4_1_;
              B[0x7d] = local_240._5_1_;
              B[0x7e] = local_240._6_1_;
              B[0x7f] = local_240._7_1_;
              OPENSSL_memcpy(out,&iter,local_240);
              out = out + B._120_8_;
              out_len = out_len - B._120_8_;
              if (out_len == 0) break;
              for (i_3 = 0; i_3 < (ulong)D._120_8_; i_3 = i_3 + 1) {
                B[i_3 - 8] = *(uint8_t *)((long)&iter + i_3 % (ulong)todo._4_4_);
              }
              if (size % (ulong)D._120_8_ != 0) {
                __assert_fail("I_len % block_size == 0",
                              "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/pkcs8/pkcs8.cc"
                              ,0xa6,
                              "int pkcs12_key_gen(const char *, size_t, const uint8_t *, size_t, uint8_t, uint32_t, size_t, uint8_t *, const EVP_MD *)"
                             );
              }
              for (uStack_208 = 0; uStack_208 < size; uStack_208 = D._120_8_ + uStack_208) {
                j._4_4_ = 1;
                uVar3 = D._120_8_;
                while (local_218 = uVar3 - 1, local_218 < (ulong)D._120_8_) {
                  uVar2 = (uint)*(byte *)(pass_raw_len + uStack_208 + local_218) +
                          (uint)*(byte *)((long)&i_3 + uVar3 + 7) + j._4_4_;
                  *(char *)(pass_raw_len + uStack_208 + local_218) = (char)uVar2;
                  j._4_4_ = uVar2 >> 8;
                  uVar3 = local_218;
                }
              }
            }
            ctx.pctx_ops._4_4_ = 1;
          }
        }
      }
    }
LAB_002dfd1c:
    OPENSSL_free((void *)pass_raw_len);
    OPENSSL_free(I);
    EVP_MD_CTX_cleanup((EVP_MD_CTX *)&pass_raw);
    pass_local._4_4_ = ctx.pctx_ops._4_4_;
  }
  return pass_local._4_4_;
}

Assistant:

int pkcs12_key_gen(const char *pass, size_t pass_len, const uint8_t *salt,
                   size_t salt_len, uint8_t id, uint32_t iterations,
                   size_t out_len, uint8_t *out, const EVP_MD *md) {
  // See https://tools.ietf.org/html/rfc7292#appendix-B. Quoted parts of the
  // specification have errata applied and other typos fixed.

  if (iterations < 1) {
    OPENSSL_PUT_ERROR(PKCS8, PKCS8_R_BAD_ITERATION_COUNT);
    return 0;
  }

  int ret = 0;
  EVP_MD_CTX ctx;
  EVP_MD_CTX_init(&ctx);
  uint8_t *pass_raw = NULL, *I = NULL;
  size_t pass_raw_len = 0, I_len = 0;

  {
    // If |pass| is NULL, we use the empty string rather than {0, 0} as the raw
    // password.
    if (pass != NULL &&
        !pkcs12_encode_password(pass, pass_len, &pass_raw, &pass_raw_len)) {
      goto err;
    }

    // In the spec, |block_size| is called "v", but measured in bits.
    size_t block_size = EVP_MD_block_size(md);

    // 1. Construct a string, D (the "diversifier"), by concatenating v/8 copies
    // of ID.
    uint8_t D[EVP_MAX_MD_BLOCK_SIZE];
    OPENSSL_memset(D, id, block_size);

    // 2. Concatenate copies of the salt together to create a string S of length
    // v(ceiling(s/v)) bits (the final copy of the salt may be truncated to
    // create S). Note that if the salt is the empty string, then so is S.
    //
    // 3. Concatenate copies of the password together to create a string P of
    // length v(ceiling(p/v)) bits (the final copy of the password may be
    // truncated to create P).  Note that if the password is the empty string,
    // then so is P.
    //
    // 4. Set I=S||P to be the concatenation of S and P.
    if (salt_len + block_size - 1 < salt_len ||
        pass_raw_len + block_size - 1 < pass_raw_len) {
      OPENSSL_PUT_ERROR(PKCS8, ERR_R_OVERFLOW);
      goto err;
    }
    size_t S_len = block_size * ((salt_len + block_size - 1) / block_size);
    size_t P_len = block_size * ((pass_raw_len + block_size - 1) / block_size);
    I_len = S_len + P_len;
    if (I_len < S_len) {
      OPENSSL_PUT_ERROR(PKCS8, ERR_R_OVERFLOW);
      goto err;
    }

    I = reinterpret_cast<uint8_t *>(OPENSSL_malloc(I_len));
    if (I_len != 0 && I == NULL) {
      goto err;
    }

    for (size_t i = 0; i < S_len; i++) {
      I[i] = salt[i % salt_len];
    }
    for (size_t i = 0; i < P_len; i++) {
      I[i + S_len] = pass_raw[i % pass_raw_len];
    }

    while (out_len != 0) {
      // A. Set A_i=H^r(D||I). (i.e., the r-th hash of D||I,
      // H(H(H(... H(D||I))))
      uint8_t A[EVP_MAX_MD_SIZE];
      unsigned A_len;
      if (!EVP_DigestInit_ex(&ctx, md, NULL) ||
          !EVP_DigestUpdate(&ctx, D, block_size) ||
          !EVP_DigestUpdate(&ctx, I, I_len) ||
          !EVP_DigestFinal_ex(&ctx, A, &A_len)) {
        goto err;
      }
      for (uint32_t iter = 1; iter < iterations; iter++) {
        if (!EVP_DigestInit_ex(&ctx, md, NULL) ||
            !EVP_DigestUpdate(&ctx, A, A_len) ||
            !EVP_DigestFinal_ex(&ctx, A, &A_len)) {
          goto err;
        }
      }

      size_t todo = out_len < A_len ? out_len : A_len;
      OPENSSL_memcpy(out, A, todo);
      out += todo;
      out_len -= todo;
      if (out_len == 0) {
        break;
      }

      // B. Concatenate copies of A_i to create a string B of length v bits (the
      // final copy of A_i may be truncated to create B).
      uint8_t B[EVP_MAX_MD_BLOCK_SIZE];
      for (size_t i = 0; i < block_size; i++) {
        B[i] = A[i % A_len];
      }

      // C. Treating I as a concatenation I_0, I_1, ..., I_(k-1) of v-bit
      // blocks, where k=ceiling(s/v)+ceiling(p/v), modify I by setting
      // I_j=(I_j+B+1) mod 2^v for each j.
      assert(I_len % block_size == 0);
      for (size_t i = 0; i < I_len; i += block_size) {
        unsigned carry = 1;
        for (size_t j = block_size - 1; j < block_size; j--) {
          carry += I[i + j] + B[j];
          I[i + j] = (uint8_t)carry;
          carry >>= 8;
        }
      }
    }

    ret = 1;
  }

err:
  OPENSSL_free(I);
  OPENSSL_free(pass_raw);
  EVP_MD_CTX_cleanup(&ctx);
  return ret;
}